

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O3

Gia_Man_t * Gia_ManTransformFlops(Gia_Man_t *p,Vec_Int_t *vFlops,Vec_Int_t *vInit)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  undefined8 uVar5;
  int *pInitState;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  size_t __size;
  int iVar9;
  
  uVar1 = vInit->nSize;
  if (uVar1 != vFlops->nSize) {
    __assert_fail("Vec_IntSize(vInit) == Vec_IntSize(vFlops)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x15a,"Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  uVar2 = p->nRegs;
  iVar9 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  if (iVar9 == 0) {
    __size = 0;
    pInitState = (int *)0x0;
  }
  else {
    __size = (long)iVar9 << 2;
    pInitState = (int *)malloc(__size);
  }
  memset(pInitState,0,__size);
  if (0 < (int)uVar1) {
    piVar4 = vFlops->pArray;
    uVar7 = 0;
    do {
      iVar3 = piVar4[uVar7];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(undefined8 *)(p->pObjs + iVar3);
      if ((~(uint)uVar5 & 0x9fffffff) != 0) {
LAB_00619b37:
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                      ,0x15e,
                      "Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      uVar8 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
      iVar3 = p->vCis->nSize;
      if ((int)uVar8 < (int)(iVar3 - uVar2)) goto LAB_00619b37;
      if (uVar1 <= uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vInit->pArray[uVar7] != 0) {
        uVar8 = (uVar2 - iVar3) + uVar8;
        if (((int)uVar8 < 0) || ((int)uVar2 <= (int)uVar8)) {
          __assert_fail("iFlopId >= 0 && iFlopId < Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                        ,0x162,
                        "Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar9 * 0x20 <= (int)uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        pInitState[uVar8 >> 5] = pInitState[uVar8 >> 5] | 1 << ((byte)uVar8 & 0x1f);
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  pGVar6 = Gia_ManDupFlip(p,pInitState);
  if (pInitState != (int *)0x0) {
    free(pInitState);
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManTransformFlops( Gia_Man_t * p, Vec_Int_t * vFlops, Vec_Int_t * vInit )
{
    Vec_Bit_t * vInitNew;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iFlopId;
    assert( Vec_IntSize(vInit) == Vec_IntSize(vFlops) );
    vInitNew = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        if ( Vec_IntEntry(vInit, i) == 0 )
            continue;
        iFlopId = Gia_ObjCioId(pObj) - Gia_ManPiNum(p);
        assert( iFlopId >= 0 && iFlopId < Gia_ManRegNum(p) );
        Vec_BitWriteEntry( vInitNew, iFlopId, 1 );
    }
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInitNew) );
    Vec_BitFree( vInitNew );
    return pNew;
}